

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter
          (Normalizer2Impl *this,UChar *start,UChar *p,UBool onlyContiguous)

{
  UChar UVar1;
  ushort uVar2;
  UCPTrie *trie;
  int iVar3;
  bool bVar4;
  
  bVar4 = true;
  if (start != p) {
    UVar1 = p[-1];
    if ((UVar1 & 0xf800U) == 0xd800) {
      if ((p + -1 == start || ((ushort)UVar1 >> 10 & 1) == 0) || ((p[-2] & 0xfc00U) != 0xd800)) {
        iVar3 = this->normTrie->dataLength + -1;
      }
      else {
        iVar3 = (uint)(ushort)UVar1 + (uint)(ushort)p[-2] * 0x400 + -0x35fdc00;
        trie = this->normTrie;
        if (iVar3 < trie->highStart) {
          iVar3 = ucptrie_internalSmallIndex_63(trie,iVar3);
        }
        else {
          iVar3 = trie->dataLength + -2;
        }
      }
    }
    else {
      iVar3 = ((ushort)UVar1 & 0x3f) + (uint)this->normTrie->index[(ushort)UVar1 >> 6];
    }
    uVar2 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)iVar3 * 2);
    if ((uVar2 & 1) == 0) {
      bVar4 = false;
    }
    else if (onlyContiguous != '\0') {
      bVar4 = true;
      if (uVar2 != 1) {
        if (uVar2 < this->limitNoNo) {
          bVar4 = *(ushort *)((long)this->extraData + (ulong)(uVar2 & 0xfffffffe)) < 0x200;
        }
        else {
          bVar4 = (uVar2 & 6) < 3;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryAfter(const UChar *start, const UChar *p,
                                            UBool onlyContiguous) const {
    if (start == p) {
        return TRUE;
    }
    UChar32 c;
    uint16_t norm16;
    UCPTRIE_FAST_U16_PREV(normTrie, UCPTRIE_16, start, p, c, norm16);
    return norm16HasCompBoundaryAfter(norm16, onlyContiguous);
}